

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

decimal_fp<double> fmt::v9::detail::dragonbox::to_decimal<double>(double x)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  char cVar20;
  uint uVar21;
  ulong uVar22;
  int iVar23;
  uint uVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  bool bVar28;
  uint128_fallback uVar29;
  decimal_fp<double> dVar30;
  
  uVar26 = (ulong)x & 0xfffffffffffff;
  uVar27 = (uint)((ulong)x >> 0x34) & 0x7ff;
  if (uVar27 == 0) {
    uVar27 = 0xfffffbce;
    if (uVar26 == 0) {
      uVar26 = 0;
      iVar19 = 0;
      goto LAB_001557a4;
    }
LAB_00155494:
    iVar19 = (int)(uVar27 * 0x4d105) >> 0x14;
    uVar29 = cache_accessor<double>::get_cached_power(2 - iVar19);
    uVar16 = uVar29.hi_;
    uVar13 = uVar29.lo_;
    iVar23 = ((2 - iVar19) * 0x1a934f >> 0x13) + uVar27;
    bVar14 = (byte)iVar23;
    uVar18 = uVar26 * 2;
    uVar22 = uVar26 * 2 + 1 << (bVar14 & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar22;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar16;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar22;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar13;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SUB168(auVar2 * auVar9,8);
    auVar12 = auVar1 * auVar8 + auVar12;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = auVar12._8_8_;
    uVar22 = SUB168(auVar3 * ZEXT816(0x20c49ba5e353f7cf),8) >> 7;
    uVar27 = auVar12._8_4_ + (int)uVar22 * -1000;
    uVar24 = (uint)(uVar16 >> (~bVar14 & 0x3f));
    if (uVar27 < uVar24) {
      if ((uVar27 != 0) || ((auVar12._0_8_ != 0 || ((uVar26 & 1) == 0)))) {
LAB_0015557d:
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar22;
        iVar19 = iVar19 + 1;
        if (SUB168(auVar5 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
            (auVar5 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
            (undefined1  [16])0x0) {
          uVar27 = 8;
          uVar26 = uVar22 / 100000000;
          do {
            uVar15 = (int)uVar26 * 0x40000000 | (uint)((int)uVar26 * -0x3d70a3d7) >> 2;
            bVar28 = uVar15 < 0x28f5c29;
            uVar24 = uVar27 + 2;
            if (!bVar28) {
              uVar24 = uVar27;
            }
            uVar27 = uVar24;
            uVar18 = (ulong)uVar15;
            if (!bVar28) {
              uVar18 = uVar26;
            }
            uVar24 = (uint)uVar18;
            uVar26 = uVar18;
          } while (bVar28);
          goto LAB_0015578a;
        }
        uVar24 = 0;
        do {
          uVar27 = uVar24;
          uVar18 = uVar22;
          uVar22 = uVar18 * -0x70a3d70a3d70a3d7 >> 2 | uVar18 << 0x3e;
          uVar24 = uVar27 + 2;
        } while (uVar22 < 0x28f5c28f5c28f5d);
        uVar22 = uVar18 * -0x3333333333333333 >> 1 | uVar18 << 0x3f;
        uVar26 = uVar22;
        if (uVar22 >= 0x199999999999999a) {
          uVar26 = uVar18;
        }
        uVar27 = uVar27 | uVar22 < 0x199999999999999a;
        goto LAB_001557a2;
      }
      uVar22 = uVar22 - 1;
      uVar27 = 1000;
    }
    else if ((uVar27 <= uVar24) &&
            (auVar4._8_8_ = 0, auVar4._0_8_ = uVar13, auVar10._8_8_ = 0, auVar10._0_8_ = uVar18 - 1,
            uVar17 = SUB168(auVar4 * auVar10,8) + uVar16 * (uVar18 - 1),
            ((uint)(uVar17 << (bVar14 & 0x3f) == 0 &&
                   SUB168(auVar4 * auVar10,0) >> 0x40 - (bVar14 & 0x3f) == 0) & ~(uint)uVar26) != 0
            || (uVar17 >> ((ulong)(byte)(0x40 - bVar14) & 0x3f) & 1) != 0)) goto LAB_0015557d;
    iVar25 = uVar27 - (uVar24 >> 1);
    uVar27 = iVar25 * 0x290 + 0x8020;
    uVar26 = (ulong)(uVar27 >> 0x10) + uVar22 * 10;
    if ((uVar27 & 0xffff) < 0x290) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar13;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = uVar18;
      uVar18 = SUB168(auVar6 * auVar11,8) + uVar16 * uVar18;
      uVar24 = 0x40 - iVar23;
      if (((uVar18 >> ((ulong)uVar24 & 0x3f) & 1) != 0) == (bool)((byte)iVar25 & 1)) {
        uVar26 = uVar26 - ((byte)(uVar27 >> 0x10) & 1 &
                          (SUB168(auVar6 * auVar11,0) >> ((byte)uVar24 & 0x3f) == 0 &&
                          uVar18 << (bVar14 & 0x3f) == 0));
      }
      else {
        uVar26 = uVar26 - 1;
      }
    }
  }
  else {
    uVar27 = uVar27 - 0x433;
    if (uVar26 != 0) {
      uVar26 = uVar26 + 0x10000000000000;
      goto LAB_00155494;
    }
    iVar19 = (int)(uVar27 * 0x9a209 + -0x3fe1f) >> 0x15;
    cVar20 = (char)(iVar19 * -0x1a934f >> 0x13) + (char)uVar27;
    uVar29 = cache_accessor<double>::get_cached_power(-iVar19);
    uVar18 = uVar29.hi_;
    bVar14 = 0xb - cVar20;
    uVar22 = (ulong)((uVar27 & 0xfffffffe) != 2) + (uVar18 - (uVar18 >> 0x36) >> (bVar14 & 0x3f));
    uVar26 = ((uVar18 >> 0x35) + uVar18 >> (bVar14 & 0x3f)) / 10;
    if (uVar26 * 10 < uVar22) {
      uVar26 = (uVar18 >> (10U - cVar20 & 0x3f)) + 1 >> 1;
      if (uVar27 == 0xffffffb3) {
        uVar26 = uVar26 & 0xfffffffffffffffe;
      }
      else {
        uVar26 = uVar26 + (uVar26 < uVar22);
      }
      goto LAB_001557a4;
    }
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar26;
    iVar19 = iVar19 + 1;
    if (SUB168(auVar7 * ZEXT816(0xabcc77118461cefd),0) < 0xabcc77118461cefd &&
        (auVar7 * ZEXT816(0xabcc77118461cefd) & (undefined1  [16])0x3ffffff) ==
        (undefined1  [16])0x0) {
      uVar26 = uVar26 / 100000000;
      uVar15 = 8;
      do {
        uVar24 = (int)uVar26 * 0x40000000 | (uint)((int)uVar26 * -0x3d70a3d7) >> 2;
        bVar28 = uVar24 < 0x28f5c29;
        uVar27 = uVar15 + 2;
        if (!bVar28) {
          uVar27 = uVar15;
        }
        uVar18 = (ulong)uVar24;
        if (!bVar28) {
          uVar18 = uVar26 & 0xffffffff;
        }
        uVar24 = (uint)uVar18;
        uVar26 = uVar18;
        uVar15 = uVar27;
      } while (bVar28);
LAB_0015578a:
      uVar21 = uVar24 * -0x33333333 >> 1 | (uint)((uVar24 * -0x33333333 & 1) != 0) << 0x1f;
      uVar15 = uVar21;
      if (uVar21 >= 0x1999999a) {
        uVar15 = uVar24;
      }
      uVar26 = (ulong)uVar15;
      uVar27 = uVar27 | uVar21 < 0x1999999a;
    }
    else {
      uVar24 = 0;
      do {
        uVar27 = uVar24;
        uVar18 = uVar26;
        uVar26 = uVar18 * -0x70a3d70a3d70a3d7 >> 2 | uVar18 << 0x3e;
        uVar24 = uVar27 + 2;
      } while (uVar26 < 0x28f5c28f5c28f5d);
      uVar22 = uVar18 * -0x3333333333333333 >> 1 | uVar18 << 0x3f;
      uVar26 = uVar22;
      if (uVar22 >= 0x199999999999999a) {
        uVar26 = uVar18;
      }
      uVar27 = uVar27 | uVar22 < 0x199999999999999a;
    }
LAB_001557a2:
    iVar19 = iVar19 + uVar27;
  }
LAB_001557a4:
  dVar30.exponent = iVar19;
  dVar30.significand = uVar26;
  dVar30._12_4_ = 0;
  return dVar30;
}

Assistant:

decimal_fp<T> to_decimal(T x) noexcept {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}